

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

int __thiscall MODEL3D::three_dim_model::import_process_info(three_dim_model *this,string *pif_path)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  string file_buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  fstream geo_file;
  int local_2b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  three_dim_model *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  anon_union_16_2_ba345be5_for_m_Storage local_268;
  ulong local_258;
  iterator_range<const_char_*> local_250;
  long local_240 [66];
  
  local_290 = this;
  std::fstream::fstream((string *)local_240);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  std::fstream::open((string *)local_240,(_Ios_Openmode)pif_path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_2b4 = 1;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) +
                              (char)(string *)local_240);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_240,(string *)&local_2b0,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (*local_2b0._M_dataplus._M_p != '*') {
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_250.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = "=";
        local_250.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = "";
        boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                  ((is_any_ofF<char> *)&local_268,&local_250);
        boost::algorithm::
        split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                  (&local_288,&local_2b0,(is_any_ofF<char> *)&local_268,token_compress_off);
        if ((0x10 < local_258) && (local_268.m_dynSet != (set_value_type *)0x0)) {
          operator_delete__(local_268.m_dynSet);
        }
        GEO::trim_string_vector(&local_288);
        iVar2 = std::__cxx11::string::compare
                          ((char *)local_288.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar2 == 0) {
          import_layer_block(local_290,(fstream *)local_240,&local_2b0,&local_2b4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_288);
      }
      local_2b4 = local_2b4 + 1;
    }
    std::fstream::close();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  std::fstream::~fstream(local_240);
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::import_process_info(const std::string &pif_path)
{
    std::fstream geo_file;
    std::string file_buffer;
    geo_file.open(pif_path, std::ios::in);
    if (geo_file.is_open())
    {
        int line_number =1;
        while (getline(geo_file, file_buffer))
        {
            if (file_buffer[0]!='*')
            {
                std::vector<std::string> split_string_vector;
                boost::split(split_string_vector, file_buffer, boost::is_any_of("="));
                GEO::trim_string_vector(split_string_vector);
                if (*split_string_vector.begin()=="$Layer")
                {
                    import_layer_block(geo_file, file_buffer, line_number);
                }
            }
            line_number++;
        }
        geo_file.close();
    }
    return EXIT_SUCCESS;
}